

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_byte.hpp
# Opt level: O0

array<unsigned_short,_256UL> * adjust_freqs(array<unsigned_long,_256UL> *freqs)

{
  ushort uVar1;
  bool bVar2;
  const_reference pvVar3;
  reference pvVar4;
  array<unsigned_short,_256UL> *in_RDI;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 in_ZMM0 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar8 [64];
  size_t sym_2;
  size_t max_sym;
  size_t max_freq;
  size_t adder;
  double ratio;
  value_type_conflict5 ncnt;
  size_t sym_1;
  int64_t excess;
  size_t sym;
  double fudge;
  size_t cur_frame_size;
  double c;
  size_t target_frame_size;
  size_t i;
  size_t initial_sum;
  size_t uniq_syms;
  size_type in_stack_ffffffffffffff48;
  array<unsigned_long,_256UL> *in_stack_ffffffffffffff50;
  ulong local_88;
  array<unsigned_long,_256UL> *local_70;
  ulong local_58;
  array<unsigned_long,_256UL> *local_50;
  ulong local_48;
  double local_40;
  ulong local_38;
  uint64_t local_28;
  ulong local_20;
  long local_18;
  long local_10;
  
  memset(in_RDI,0,0x200);
  local_10 = 0;
  local_18 = 0;
  local_20 = 0;
  local_70 = in_stack_ffffffffffffff50;
  while( true ) {
    auVar7 = in_ZMM1._0_16_;
    auVar6 = in_ZMM0._0_16_;
    if (0xff < local_20) break;
    pvVar3 = std::array<unsigned_long,_256UL>::operator[](local_70,in_stack_ffffffffffffff48);
    local_18 = *pvVar3 + local_18;
    pvVar3 = std::array<unsigned_long,_256UL>::operator[](local_70,in_stack_ffffffffffffff48);
    local_10 = (ulong)(*pvVar3 != 0) + local_10;
    local_20 = local_20 + 1;
  }
  local_28 = local_10 << 6;
  if (0x1000 < local_28) {
    local_28 = 0x1000;
  }
  bVar2 = is_power_of_two(local_28);
  if (!bVar2) {
    local_28 = next_power_of_two(local_28);
  }
  auVar6 = vcvtusi2sd_avx512f(auVar6,local_28);
  auVar7 = vcvtusi2sd_avx512f(auVar7,local_18);
  auVar8 = ZEXT1664(auVar7);
  dVar5 = auVar6._0_8_ / auVar7._0_8_;
  local_38 = std::numeric_limits<unsigned_long>::max();
  local_40 = 1.0;
  while (local_28 < local_38) {
    auVar8 = ZEXT1664(ZEXT816(0x3f847ae147ae147b));
    local_40 = local_40 - 0.01;
    local_38 = 0;
    for (local_48 = 0; auVar6 = auVar8._0_16_, local_48 < 0x100; local_48 = local_48 + 1) {
      pvVar3 = std::array<unsigned_long,_256UL>::operator[](local_70,in_stack_ffffffffffffff48);
      auVar6 = vcvtusi2sd_avx512f(auVar6,*pvVar3);
      auVar8 = ZEXT864((ulong)dVar5);
      pvVar4 = std::array<unsigned_short,_256UL>::operator[]
                         ((array<unsigned_short,_256UL> *)local_70,in_stack_ffffffffffffff48);
      *pvVar4 = (value_type_conflict5)(int)(local_40 * auVar6._0_8_ * dVar5);
      pvVar4 = std::array<unsigned_short,_256UL>::operator[]
                         ((array<unsigned_short,_256UL> *)local_70,in_stack_ffffffffffffff48);
      if ((*pvVar4 == 0) &&
         (pvVar3 = std::array<unsigned_long,_256UL>::operator[](local_70,in_stack_ffffffffffffff48),
         *pvVar3 != 0)) {
        pvVar4 = std::array<unsigned_short,_256UL>::operator[]
                           ((array<unsigned_short,_256UL> *)local_70,in_stack_ffffffffffffff48);
        *pvVar4 = 1;
      }
      pvVar4 = std::array<unsigned_short,_256UL>::operator[]
                         ((array<unsigned_short,_256UL> *)local_70,in_stack_ffffffffffffff48);
      local_38 = *pvVar4 + local_38;
    }
  }
  local_50 = (array<unsigned_long,_256UL> *)(local_28 - local_38);
  for (local_58 = 0; local_58 < 0x100; local_58 = local_58 + 1) {
    pvVar4 = std::array<unsigned_short,_256UL>::operator[]
                       ((array<unsigned_short,_256UL> *)local_70,in_stack_ffffffffffffff48);
    uVar1 = *pvVar4;
    if (uVar1 != 0) {
      auVar6 = vcvtusi2sd_avx512f(auVar8._0_16_,local_38);
      auVar8 = ZEXT1664(CONCAT88(auVar6._8_8_,(double)uVar1));
      auVar7._8_8_ = 0;
      auVar7._0_8_ = ((double)(long)local_50 / auVar6._0_8_) * (double)uVar1;
      local_70 = (array<unsigned_long,_256UL> *)vcvttsd2usi_avx512f(auVar7);
      if (local_50 < local_70) {
        local_70 = local_50;
      }
      local_50 = (array<unsigned_long,_256UL> *)((long)local_50 - (long)local_70);
      local_38 = local_38 - uVar1;
      pvVar4 = std::array<unsigned_short,_256UL>::operator[]
                         ((array<unsigned_short,_256UL> *)local_70,in_stack_ffffffffffffff48);
      *pvVar4 = *pvVar4 + (short)local_70;
    }
  }
  if (local_50 != (array<unsigned_long,_256UL> *)0x0) {
    uVar1 = 0;
    for (local_88 = 0; local_88 < 0x100; local_88 = local_88 + 1) {
      pvVar4 = std::array<unsigned_short,_256UL>::operator[]
                         ((array<unsigned_short,_256UL> *)local_70,in_stack_ffffffffffffff48);
      if (uVar1 < *pvVar4) {
        pvVar4 = std::array<unsigned_short,_256UL>::operator[]
                           ((array<unsigned_short,_256UL> *)local_70,in_stack_ffffffffffffff48);
        uVar1 = *pvVar4;
      }
    }
    pvVar4 = std::array<unsigned_short,_256UL>::operator[]
                       ((array<unsigned_short,_256UL> *)local_70,(size_type)local_50);
    *pvVar4 = *pvVar4 + (short)local_50;
  }
  return in_RDI;
}

Assistant:

std::array<uint16_t, constants::MAX_SIGMA> adjust_freqs(
    const std::array<uint64_t, constants::MAX_SIGMA>& freqs)
{
    std::array<uint16_t, constants::MAX_SIGMA> adj_freqs { 0 };
    size_t uniq_syms = 0;
    size_t initial_sum = 0;
    for (size_t i = 0; i < constants::MAX_SIGMA; i++) {
        initial_sum += freqs[i];
        uniq_syms += freqs[i] != 0;
    }
    size_t target_frame_size = uniq_syms * constants::FRAME_FACTOR;
    if (target_frame_size > constants::MAX_FRAME_SIZE) {
        target_frame_size = constants::MAX_FRAME_SIZE;
    }
    if (!is_power_of_two(target_frame_size)) {
        target_frame_size = next_power_of_two(target_frame_size);
    }

    double c = double(target_frame_size) / double(initial_sum);
    size_t cur_frame_size = std::numeric_limits<uint64_t>::max();
    double fudge = 1.0;
    while (cur_frame_size > target_frame_size) {
        fudge -= 0.01;
        cur_frame_size = 0;
        for (size_t sym = 0; sym < constants::MAX_SIGMA; sym++) {
            adj_freqs[sym] = (fudge * double(freqs[sym]) * c);
            if (adj_freqs[sym] == 0 && freqs[sym] != 0)
                adj_freqs[sym] = 1;
            cur_frame_size += adj_freqs[sym];
        }
    }
    int64_t excess = target_frame_size - cur_frame_size;
    for (size_t sym = 0; sym < constants::MAX_SIGMA; sym++) {
        auto ncnt = adj_freqs[constants::MAX_SIGMA - sym - 1];
        if (ncnt == 0)
            continue;
        double ratio = double(excess) / double(cur_frame_size);
        size_t adder = size_t(ratio * double(ncnt));
        if (adder > excess) {
            adder = excess;
        }
        excess -= adder;
        cur_frame_size -= ncnt;
        adj_freqs[constants::MAX_SIGMA - sym - 1] += adder;
    }
    if (excess != 0) {
        size_t max_freq = 0;
        size_t max_sym = 0;
        for (size_t sym = 0; sym < constants::MAX_SIGMA; sym++) {
            if (adj_freqs[sym] > max_freq) {
                max_freq = adj_freqs[sym];
                max_sym = sym;
            }
        }
        adj_freqs[max_sym] += excess;
    }
    return adj_freqs;
}